

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void helics::loadFlags(FederateInfo *fedInfo,string *flags)

{
  string_view delimiters;
  string_view line;
  bool bVar1;
  reference this;
  const_iterator pvVar2;
  const_iterator pvVar3;
  reference pvVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  errc eVar6;
  long in_RDI;
  __integer_from_chars_result_type<int> _Var7;
  _Quoted_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var8;
  _Quoted_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var9;
  _Quoted_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_stack_00000068;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000070;
  char *ptr;
  int val;
  value_type *loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flg;
  iterator __end1;
  iterator __begin1;
  stringVector *__range1;
  stringVector sflgs;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  CoreFederateInfo *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_97UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined8 in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  undefined1 *local_50;
  undefined8 local_48;
  char *local_40;
  __sv_type local_38;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = in_RDI;
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe90);
  local_48 = 2;
  local_40 = ",;";
  line._M_str._0_4_ = in_stack_fffffffffffffea8;
  line._M_len = (size_t)in_stack_fffffffffffffea0;
  line._M_str._4_4_ = in_stack_fffffffffffffeac;
  delimiters._M_str = (char *)in_stack_fffffffffffffe98;
  delimiters._M_len = (size_t)in_stack_fffffffffffffe90;
  gmlc::utilities::stringOps::splitline_abi_cxx11_
            (line,delimiters,(delimiter_compression)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  local_50 = local_28;
  local_58._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CLI::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe88);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffe88);
  _Var8._M_delim = (char)in_stack_fffffffffffffeb0;
  _Var8._M_escape = (char)((ulong)in_stack_fffffffffffffeb0 >> 8);
  _Var8._10_6_ = (int6)((ulong)in_stack_fffffffffffffeb0 >> 0x10);
  _Var8._M_string = in_stack_fffffffffffffeb8;
  _Var9._8_8_ = in_stack_fffffffffffffe90;
  _Var9._M_string = in_stack_fffffffffffffe98;
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           (_Var9._8_8_,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffe88), ((bVar1 ^ 0xffU) & 1) != 0) {
    this = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_58);
    bVar1 = std::operator==(_Var9._8_8_,(char *)in_stack_fffffffffffffe88);
    if (bVar1) {
      *(undefined1 *)(local_8 + 0x4d) = 1;
    }
    else {
      bVar1 = std::operator==(_Var9._8_8_,(char *)in_stack_fffffffffffffe88);
      if (bVar1) {
        *(undefined1 *)(local_8 + 0x4e) = 1;
      }
      else {
        bVar1 = std::operator==(_Var9._8_8_,(char *)in_stack_fffffffffffffe88);
        if (bVar1) {
          *(undefined1 *)(local_8 + 0x59) = 1;
        }
        bVar1 = std::operator==(_Var9._8_8_,(char *)in_stack_fffffffffffffe88);
        if (bVar1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(_Var9._8_8_,(char *)in_stack_fffffffffffffe88);
        }
        bVar1 = std::operator==(_Var9._8_8_,(char *)in_stack_fffffffffffffe88);
        if (bVar1) {
          *(undefined1 *)(local_8 + 0x4f) = 1;
        }
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x353782);
        if (!bVar1) {
          pvVar2 = frozen::
                   unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,97ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                   ::find<std::__cxx11::string>(in_stack_fffffffffffffea0,_Var9._M_string);
          pvVar3 = frozen::
                   unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_97UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_97UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x3537ce);
          if (pvVar2 == pvVar3) {
            pvVar4 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )_Var9._8_8_);
            if (*pvVar4 == '-') {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     (size_type)in_stack_fffffffffffffea0,(size_type)_Var9._M_string);
              pvVar2 = frozen::
                       unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,97ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                       ::find<std::__cxx11::string>(in_stack_fffffffffffffea0,_Var9._M_string);
              std::__cxx11::string::~string(_Var9._8_8_);
              pvVar3 = frozen::
                       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_97UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_97UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)0x353889);
              if (pvVar2 != pvVar3) {
                CoreFederateInfo::setFlagOption
                          (_Var9._8_8_,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
              }
            }
            else {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3538f7);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x353909);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(this);
              _Var7 = std::from_chars<int>
                                ((char *)in_stack_fffffffffffffec0,(char *)_Var8._M_string,
                                 _Var8._8_8_,in_stack_fffffffffffffeac);
              this_00 = _Var9._8_8_;
              eVar6 = _Var7.ec;
              if (eVar6 == 0) {
                CoreFederateInfo::setFlagOption
                          (this_00,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
              }
              else if (eVar6 == invalid_argument) {
                in_stack_fffffffffffffec0 =
                     std::operator<<((ostream *)&std::cerr,"unrecognized flag ");
                _Var8 = std::quoted<char,std::char_traits<char>,std::allocator<char>>
                                  (_Var9._8_8_,(char)((ulong)in_stack_fffffffffffffe88 >> 0x38),
                                   (char)((ulong)in_stack_fffffffffffffe88 >> 0x30));
                pbVar5 = std::__detail::operator<<(in_stack_00000070,in_stack_00000068);
                in_stack_fffffffffffffea8 = SUB84(pbVar5,0);
                in_stack_fffffffffffffeac = (int)((ulong)pbVar5 >> 0x20);
                std::operator<<((ostream *)pbVar5,'\n');
              }
              else if (eVar6 == result_out_of_range) {
                in_stack_fffffffffffffea0 =
                     (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_97UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)std::operator<<((ostream *)&std::cerr,
                                        "unrecognized flag numerical value out of range ");
                _Var9 = std::quoted<char,std::char_traits<char>,std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)this_00,(char)((ulong)in_stack_fffffffffffffe88 >> 0x38),
                                   (char)((ulong)in_stack_fffffffffffffe88 >> 0x30));
                in_stack_fffffffffffffe88 =
                     std::__detail::operator<<(in_stack_00000070,in_stack_00000068);
                std::operator<<((ostream *)in_stack_fffffffffffffe88,'\n');
              }
            }
          }
          else {
            CoreFederateInfo::setFlagOption
                      (_Var9._8_8_,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                       SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_58);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

static void loadFlags(FederateInfo& fedInfo, const std::string& flags)
{
    auto sflgs = gmlc::utilities::stringOps::splitline(flags);
    for (auto& flg : sflgs) {
        if (flg == "autobroker") {
            fedInfo.autobroker = true;
            continue;
        }
        if (flg == "debugging") {
            fedInfo.debugging = true;
            continue;
        }
        if (flg == "json") {
            fedInfo.useJsonSerialization = true;
            // purposely not continuing here so the setFlagOption gets called
        }
        if (flg == "profiling") {
            fedInfo.profilerFileName = "log";
            // purposely not continuing here so the setFlagOption gets called
        }
        if (flg == "observer") {
            fedInfo.observer = true;
            // purposely not continuing here so the setFlagOption gets called
        }
        if (flg.empty()) {
            continue;  // LCOV_EXCL_LINE
        }
        const auto* loc = flagStringsTranslations.find(flg);
        if (loc != flagStringsTranslations.end()) {
            fedInfo.setFlagOption(loc->second, true);
        } else {
            if (flg.front() == '-') {
                loc = flagStringsTranslations.find(flg.substr(1));
                if (loc != flagStringsTranslations.end()) {
                    fedInfo.setFlagOption(loc->second, false);
                }
                continue;
            }

            int val{};
            auto [ptr, ec] = std::from_chars(flg.data(), flg.data() + flg.size(), val);

            if (ec == std::errc()) {
                fedInfo.setFlagOption(std::abs(val), (val > 0));
            } else if (ec == std::errc::invalid_argument) {
                std::cerr << "unrecognized flag " << std::quoted(flg) << '\n';
            } else if (ec == std::errc::result_out_of_range) {
                std::cerr << "unrecognized flag numerical value out of range " << std::quoted(flg)
                          << '\n';
            }
        }
    }
}